

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O3

void __thiscall
duckdb::LocalFileSystem::Seek(LocalFileSystem *this,FileHandle *handle,idx_t location)

{
  int iVar1;
  IOException *this_00;
  string local_40;
  
  iVar1 = (*(this->super_FileSystem)._vptr_FileSystem[0x24])();
  if ((char)iVar1 != '\0') {
    SetFilePointer(this,handle,location);
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Cannot seek in files of this type","");
  IOException::IOException(this_00,&local_40);
  __cxa_throw(this_00,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void LocalFileSystem::Seek(FileHandle &handle, idx_t location) {
	if (!CanSeek()) {
		throw IOException("Cannot seek in files of this type");
	}
	SetFilePointer(handle, location);
}